

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction.cpp
# Opt level: O3

vector<RPCArg,_std::allocator<RPCArg>_> * CreateTxDoc(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  string name;
  string name_00;
  string name_01;
  string name_02;
  string name_03;
  string name_04;
  string name_05;
  string name_06;
  string name_07;
  string name_08;
  string name_09;
  string name_10;
  Fallback fallback;
  Fallback fallback_00;
  Fallback fallback_01;
  Fallback fallback_02;
  Fallback fallback_03;
  Fallback fallback_04;
  Fallback fallback_05;
  Fallback fallback_06;
  Fallback fallback_07;
  Fallback fallback_08;
  Fallback fallback_09;
  Fallback fallback_10;
  vector<RPCArg,_std::allocator<RPCArg>_> inner;
  vector<RPCArg,_std::allocator<RPCArg>_> inner_00;
  vector<RPCArg,_std::allocator<RPCArg>_> inner_01;
  vector<RPCArg,_std::allocator<RPCArg>_> inner_02;
  vector<RPCArg,_std::allocator<RPCArg>_> inner_03;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  RPCArgOptions opts_01;
  RPCArgOptions opts_02;
  RPCArgOptions opts_03;
  RPCArgOptions opts_04;
  long *plVar3;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_RDI;
  long lVar4;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCArg> __l_01;
  initializer_list<RPCArg> __l_02;
  initializer_list<RPCArg> __l_03;
  initializer_list<RPCArg> __l_04;
  undefined8 in_stack_ffffffffffffe708;
  undefined1 *puVar5;
  undefined1 in_stack_ffffffffffffe710 [23];
  bool in_stack_ffffffffffffe727;
  bool bVar6;
  int in_stack_ffffffffffffe728;
  int iVar7;
  undefined1 in_stack_ffffffffffffe72c [92];
  string in_stack_ffffffffffffe788;
  undefined1 in_stack_ffffffffffffe7a8 [16];
  undefined1 in_stack_ffffffffffffe7b8;
  undefined7 in_stack_ffffffffffffe7b9;
  undefined8 in_stack_ffffffffffffe7c0;
  undefined8 in_stack_ffffffffffffe7c8;
  undefined1 in_stack_ffffffffffffe7d0;
  undefined1 uVar8;
  undefined7 in_stack_ffffffffffffe7d1;
  undefined8 in_stack_ffffffffffffe7d8;
  pointer in_stack_ffffffffffffe7e0;
  undefined2 in_stack_ffffffffffffe7e8;
  undefined6 in_stack_ffffffffffffe7ea;
  long *local_1800 [2];
  long local_17f0 [2];
  UniValue local_17e0;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_1788;
  undefined1 local_1730;
  long *local_1728 [2];
  long local_1718 [2];
  undefined1 local_1708;
  undefined1 *local_1700;
  undefined8 local_16f8;
  undefined1 local_16f0;
  undefined7 uStack_16ef;
  undefined1 local_16e0 [32];
  long *local_16c0 [2];
  long local_16b0 [2];
  UniValue local_16a0;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_1648;
  undefined1 local_15f0;
  long *local_15e8 [2];
  long local_15d8 [2];
  undefined1 local_15c8 [8];
  undefined1 *local_15c0;
  undefined8 local_15b8;
  undefined1 local_15b0;
  undefined7 uStack_15af;
  undefined1 local_15a0 [32];
  undefined1 local_1580 [8];
  undefined1 *local_1578;
  undefined8 local_1570;
  undefined1 local_1568;
  undefined7 uStack_1567;
  undefined1 local_1558 [32];
  undefined1 local_1538;
  undefined1 *local_1530;
  undefined8 local_1528;
  undefined1 local_1520;
  undefined7 uStack_151f;
  undefined1 local_1510 [32];
  long *local_14f0 [2];
  long local_14e0 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_14d0;
  undefined1 local_1478;
  long *local_1470 [2];
  long local_1460 [2];
  RPCArg local_1450;
  long *local_1348 [2];
  long local_1338 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_1328;
  undefined1 local_12d0;
  long *local_12c8 [2];
  long local_12b8 [2];
  undefined1 local_12a8 [8];
  undefined1 *local_12a0;
  undefined8 local_1298;
  undefined1 local_1290;
  undefined7 uStack_128f;
  undefined1 local_1280 [32];
  undefined1 local_1260;
  undefined1 *local_1258;
  undefined8 local_1250;
  undefined1 local_1248;
  undefined7 uStack_1247;
  undefined1 local_1238 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1218;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_11f8;
  undefined1 local_11a0;
  long *local_1198 [2];
  long local_1188 [2];
  undefined1 local_1178 [216];
  undefined1 local_10a0 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1090;
  long *local_1070 [2];
  long local_1060 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_1050;
  undefined1 local_ff8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_ff0;
  RPCArg local_fd0;
  RPCArg local_ec8;
  long *local_dc0 [2];
  long local_db0 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_da0;
  undefined1 local_d48;
  long *local_d40 [2];
  long local_d30 [2];
  undefined1 local_d20 [8];
  undefined1 *local_d18;
  undefined8 local_d10;
  undefined1 local_d08;
  undefined7 uStack_d07;
  undefined1 local_cf8 [32];
  undefined1 local_cd8 [8];
  undefined1 *local_cd0;
  undefined8 local_cc8;
  undefined1 local_cc0;
  undefined7 uStack_cbf;
  undefined1 local_cb0 [32];
  undefined1 local_c90;
  undefined1 *local_c88;
  undefined8 local_c80;
  undefined1 local_c78;
  undefined7 uStack_c77;
  undefined1 local_c68 [32];
  long *local_c48 [2];
  long local_c38 [2];
  uint *local_c28;
  undefined8 local_c20;
  uint local_c18;
  undefined4 uStack_c14;
  undefined4 uStack_c10;
  undefined4 uStack_c0c;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_c08;
  undefined1 local_bb0;
  long *local_ba8 [2];
  long local_b98 [2];
  undefined1 local_b88;
  undefined1 *local_b80;
  undefined8 local_b78;
  undefined1 local_b70;
  undefined7 uStack_b6f;
  undefined1 local_b60 [32];
  long *local_b40 [2];
  long local_b30 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_b20;
  undefined1 local_ac8;
  long *local_ac0 [2];
  long local_ab0 [2];
  undefined1 local_aa0;
  vector<RPCArg,_std::allocator<RPCArg>_> local_a98;
  undefined1 auStack_a80 [8];
  undefined1 local_a78 [32];
  long *local_a58 [2];
  long local_a48 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_a38;
  undefined1 local_9e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_9d8;
  RPCArg local_9b8;
  RPCArg local_8b0;
  RPCArg local_7a8;
  long *local_6a0 [2];
  long local_690 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_680;
  undefined1 local_628;
  long *local_620 [2];
  long local_610 [2];
  undefined1 local_600 [216];
  undefined1 local_528 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_518;
  long *local_4f8 [2];
  long local_4e8 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_4d8;
  undefined1 local_480;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_478;
  RPCArg local_458;
  RPCArg local_350;
  RPCArg local_248;
  RPCArg local_140;
  vector<RPCArg,_std::allocator<RPCArg>_> *local_38;
  
  local_1050._32_8_ = 0;
  local_38 = *(vector<RPCArg,_std::allocator<RPCArg>_> **)(in_FS_OFFSET + 0x28);
  local_478.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_478.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"inputs","");
  local_4d8._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_480 = 0;
  local_4f8[0] = local_4e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4f8,"The inputs","");
  local_620[0] = local_610;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_620,"");
  local_680._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_628 = 0;
  local_6a0[0] = local_690;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6a0,"");
  local_9d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_9d8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9d8,"txid","");
  local_a38._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_9e0 = 0;
  local_a58[0] = local_a48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a58,"The transaction id","");
  local_a98.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((long)&local_a98.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl
                      + 0x10);
  local_aa0 = 0;
  local_a98.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_a98.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_a78._0_8_ = (pointer)0x0;
  local_a78._8_2_ = 0;
  local_a78._10_6_ = 0;
  local_a78._16_2_ = 0;
  local_a78._18_8_ = 0;
  name._8_23_ = in_stack_ffffffffffffe710;
  name._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe708;
  name.field_2._M_local_buf[0xf] = in_stack_ffffffffffffe727;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._4_92_
       = in_stack_ffffffffffffe72c;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)
       (_Uninitialized<RPCArg::Optional,_true>)in_stack_ffffffffffffe728;
  opts.oneline_description._M_string_length._0_1_ = in_stack_ffffffffffffe7b8;
  opts.skip_type_check = (bool)in_stack_ffffffffffffe7a8[0];
  opts._1_7_ = in_stack_ffffffffffffe7a8._1_7_;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe7a8._8_8_;
  opts.oneline_description._M_string_length._1_7_ = in_stack_ffffffffffffe7b9;
  opts.oneline_description.field_2._M_allocated_capacity = in_stack_ffffffffffffe7c0;
  opts.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe7c8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = in_stack_ffffffffffffe7d0;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._1_7_ = in_stack_ffffffffffffe7d1;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe7d8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffe7e0;
  opts.hidden = (bool)(char)in_stack_ffffffffffffe7e8;
  opts.also_positional = (bool)(char)((ushort)in_stack_ffffffffffffe7e8 >> 8);
  opts._66_6_ = in_stack_ffffffffffffe7ea;
  RPCArg::RPCArg(&local_9b8,name,(Type)&local_9d8,fallback,in_stack_ffffffffffffe788,opts);
  local_ac0[0] = local_ab0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ac0,"vout","");
  local_b20._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_ac8 = 0;
  local_b40[0] = local_b30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b40,"The output number","");
  local_b80 = &local_b70;
  local_b88 = 0;
  local_b78 = 0;
  local_b70 = 0;
  local_b60._0_8_ = (pointer)0x0;
  local_b60._8_2_ = 0;
  local_b60._10_6_ = 0;
  local_b60._16_2_ = 0;
  local_b60._18_8_ = 0;
  name_00._8_23_ = in_stack_ffffffffffffe710;
  name_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe708;
  name_00.field_2._M_local_buf[0xf] = in_stack_ffffffffffffe727;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._4_92_
       = in_stack_ffffffffffffe72c;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)
       (_Uninitialized<RPCArg::Optional,_true>)in_stack_ffffffffffffe728;
  opts_00.oneline_description._M_string_length._0_1_ = in_stack_ffffffffffffe7b8;
  opts_00.skip_type_check = (bool)in_stack_ffffffffffffe7a8[0];
  opts_00._1_7_ = in_stack_ffffffffffffe7a8._1_7_;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe7a8._8_8_;
  opts_00.oneline_description._M_string_length._1_7_ = in_stack_ffffffffffffe7b9;
  opts_00.oneline_description.field_2._M_allocated_capacity = in_stack_ffffffffffffe7c0;
  opts_00.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe7c8;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = in_stack_ffffffffffffe7d0;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._1_7_ = in_stack_ffffffffffffe7d1;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe7d8;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffe7e0;
  opts_00.hidden = (bool)(char)in_stack_ffffffffffffe7e8;
  opts_00.also_positional = (bool)(char)((ushort)in_stack_ffffffffffffe7e8 >> 8);
  opts_00._66_6_ = in_stack_ffffffffffffe7ea;
  RPCArg::RPCArg(&local_8b0,name_00,(Type)local_ac0,fallback_00,in_stack_ffffffffffffe788,opts_00);
  local_ba8[0] = local_b98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ba8,"sequence","");
  local_c28 = &local_c18;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c28,
             "depends on the value of the \'replaceable\' and \'locktime\' arguments","");
  local_c08._0_8_ = (long)&local_c08 + 0x10;
  if (local_c28 == &local_c18) {
    local_c08._24_4_ = uStack_c10;
    local_c08._28_4_ = uStack_c0c;
  }
  else {
    local_c08._0_8_ = local_c28;
  }
  local_c08._8_8_ = local_c20;
  local_c20 = 0;
  local_c18 = local_c18 & 0xffffff00;
  local_bb0 = 1;
  local_c48[0] = local_c38;
  local_c28 = &local_c18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c48,"The sequence number","");
  local_c88 = &local_c78;
  local_c90 = 0;
  local_c80 = 0;
  local_c78 = 0;
  local_c68._0_8_ = (pointer)0x0;
  local_c68._8_2_ = 0;
  local_c68._10_6_ = 0;
  local_c68._16_2_ = 0;
  local_c68._18_8_ = 0;
  name_01._8_23_ = in_stack_ffffffffffffe710;
  name_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe708;
  name_01.field_2._M_local_buf[0xf] = in_stack_ffffffffffffe727;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._4_92_
       = in_stack_ffffffffffffe72c;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)
       (_Uninitialized<RPCArg::Optional,_true>)in_stack_ffffffffffffe728;
  opts_01.oneline_description._M_string_length._0_1_ = in_stack_ffffffffffffe7b8;
  opts_01.skip_type_check = (bool)in_stack_ffffffffffffe7a8[0];
  opts_01._1_7_ = in_stack_ffffffffffffe7a8._1_7_;
  opts_01.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe7a8._8_8_;
  opts_01.oneline_description._M_string_length._1_7_ = in_stack_ffffffffffffe7b9;
  opts_01.oneline_description.field_2._M_allocated_capacity = in_stack_ffffffffffffe7c0;
  opts_01.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe7c8;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = in_stack_ffffffffffffe7d0;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._1_7_ = in_stack_ffffffffffffe7d1;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe7d8;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffe7e0;
  opts_01.hidden = (bool)(char)in_stack_ffffffffffffe7e8;
  opts_01.also_positional = (bool)(char)((ushort)in_stack_ffffffffffffe7e8 >> 8);
  opts_01._66_6_ = in_stack_ffffffffffffe7ea;
  RPCArg::RPCArg(&local_7a8,name_01,(Type)local_ba8,fallback_01,in_stack_ffffffffffffe788,opts_01);
  __l._M_len = 3;
  __l._M_array = &local_9b8;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xffffffffffffe788,__l,
             (allocator_type *)&stack0xffffffffffffe787);
  local_cd0 = &local_cc0;
  local_cd8[0] = 0;
  local_cc8 = 0;
  local_cc0 = 0;
  local_cb0._0_8_ = (pointer)0x0;
  local_cb0._8_2_ = 0;
  local_cb0._10_6_ = 0;
  local_cb0._16_2_ = 0;
  local_cb0._18_8_ = 0;
  name_02._8_23_ = in_stack_ffffffffffffe710;
  name_02._M_dataplus._M_p = local_cd8;
  name_02.field_2._M_local_buf[0xf] = in_stack_ffffffffffffe727;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._4_92_
       = in_stack_ffffffffffffe72c;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)
       (_Uninitialized<RPCArg::Optional,_true>)in_stack_ffffffffffffe728;
  inner.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = in_stack_ffffffffffffe7b8;
  inner.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)in_stack_ffffffffffffe7a8._0_8_;
  inner.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffe7a8._8_8_;
  inner.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._1_7_ = in_stack_ffffffffffffe7b9;
  RPCArg::RPCArg((RPCArg *)local_600,name_02,(Type)local_620,fallback_02,in_stack_ffffffffffffe788,
                 inner,(RPCArgOptions *)0x0);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_600;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xffffffffffffe7a0,__l_00,
             (allocator_type *)&stack0xffffffffffffe786);
  local_d18 = &local_d08;
  local_d20[0] = 0;
  local_d10 = 0;
  local_d08 = 0;
  local_cf8._0_8_ = (pointer)0x0;
  local_cf8._8_2_ = 0;
  local_cf8._10_6_ = 0;
  local_cf8._16_2_ = 0;
  local_cf8._18_8_ = 0;
  puVar5 = local_d20;
  name_03._8_23_ = in_stack_ffffffffffffe710;
  name_03._M_dataplus._M_p = puVar5;
  name_03.field_2._M_local_buf[0xf] = in_stack_ffffffffffffe727;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._4_92_
       = in_stack_ffffffffffffe72c;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)
       (_Uninitialized<RPCArg::Optional,_true>)in_stack_ffffffffffffe728;
  inner_00.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = in_stack_ffffffffffffe7b8;
  inner_00.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffe7a8._0_8_;
  inner_00.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffe7a8._8_8_;
  inner_00.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._1_7_ = in_stack_ffffffffffffe7b9;
  RPCArg::RPCArg(&local_458,name_03,(Type)&local_478,fallback_03,in_stack_ffffffffffffe788,inner_00,
                 (RPCArgOptions *)0x1);
  local_d40[0] = local_d30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d40,"outputs","");
  local_da0._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_d48 = 0;
  local_dc0[0] = local_db0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_dc0,
             "The outputs specified as key-value pairs.\nEach key may only appear once, i.e. there can only be one \'data\' output, and no address may be duplicated.\nAt least one output of either type must be specified.\nFor compatibility reasons, a dictionary, which holds the key-value pairs directly, is also\n                             accepted as second parameter."
             ,"");
  local_ff0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_ff0.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ff0,"");
  local_1050._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_ff8 = 0;
  local_1070[0] = local_1060;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1070,"");
  local_1198[0] = local_1188;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1198,"address","");
  local_11f8._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_11a0 = 0;
  std::operator+(&local_1218,
                 "A key-value pair. The key (string) is the bitcoin address, the value (float or string) is the amount in "
                 ,&CURRENCY_UNIT_abi_cxx11_);
  local_1258 = &local_1248;
  local_1260 = 0;
  local_1250 = 0;
  local_1248 = 0;
  local_1238._0_8_ = (pointer)0x0;
  local_1238._8_2_ = 0;
  local_1238._10_6_ = 0;
  local_1238._16_2_ = 0;
  local_1238._18_8_ = 0;
  name_04._8_23_ = in_stack_ffffffffffffe710;
  name_04._M_dataplus._M_p = puVar5;
  name_04.field_2._M_local_buf[0xf] = in_stack_ffffffffffffe727;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._4_92_
       = in_stack_ffffffffffffe72c;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)
       (_Uninitialized<RPCArg::Optional,_true>)in_stack_ffffffffffffe728;
  opts_02.oneline_description._M_string_length._0_1_ = in_stack_ffffffffffffe7b8;
  opts_02.skip_type_check = (bool)in_stack_ffffffffffffe7a8[0];
  opts_02._1_7_ = in_stack_ffffffffffffe7a8._1_7_;
  opts_02.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe7a8._8_8_;
  opts_02.oneline_description._M_string_length._1_7_ = in_stack_ffffffffffffe7b9;
  opts_02.oneline_description.field_2._M_allocated_capacity = in_stack_ffffffffffffe7c0;
  opts_02.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe7c8;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = in_stack_ffffffffffffe7d0;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._1_7_ = in_stack_ffffffffffffe7d1;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe7d8;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffe7e0;
  opts_02.hidden = (bool)(char)in_stack_ffffffffffffe7e8;
  opts_02.also_positional = (bool)(char)((ushort)in_stack_ffffffffffffe7e8 >> 8);
  opts_02._66_6_ = in_stack_ffffffffffffe7ea;
  RPCArg::RPCArg((RPCArg *)local_1178,name_04,(Type)local_1198,fallback_04,in_stack_ffffffffffffe788
                 ,opts_02);
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)local_1178;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xffffffffffffe750,__l_01,
             (allocator_type *)&stack0xffffffffffffe74f);
  local_12a0 = &local_1290;
  local_12a8[0] = 0;
  local_1298 = 0;
  local_1290 = 0;
  local_1280._0_8_ = (pointer)0x0;
  local_1280._8_2_ = 0;
  local_1280._10_6_ = 0;
  local_1280._16_2_ = 0;
  local_1280._18_8_ = 0;
  puVar5 = local_12a8;
  name_05._8_23_ = in_stack_ffffffffffffe710;
  name_05._M_dataplus._M_p = puVar5;
  name_05.field_2._M_local_buf[0xf] = in_stack_ffffffffffffe727;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._4_92_
       = in_stack_ffffffffffffe72c;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)
       (_Uninitialized<RPCArg::Optional,_true>)in_stack_ffffffffffffe728;
  inner_01.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = in_stack_ffffffffffffe7b8;
  inner_01.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffe7a8._0_8_;
  inner_01.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffe7a8._8_8_;
  inner_01.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._1_7_ = in_stack_ffffffffffffe7b9;
  RPCArg::RPCArg(&local_fd0,name_05,(Type)&local_ff0,fallback_05,in_stack_ffffffffffffe788,inner_01,
                 (RPCArgOptions *)0x6);
  local_12c8[0] = local_12b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_12c8,"");
  local_1328._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_12d0 = 0;
  local_1348[0] = local_1338;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1348,"");
  local_1470[0] = local_1460;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1470,"data","");
  local_14d0._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_1478 = 0;
  local_14f0[0] = local_14e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_14f0,
             "A key-value pair. The key must be \"data\", the value is hex-encoded data","");
  local_1530 = &local_1520;
  local_1538 = 0;
  local_1528 = 0;
  local_1520 = 0;
  local_1510._0_8_ = (pointer)0x0;
  local_1510._8_2_ = 0;
  local_1510._10_6_ = 0;
  local_1510._16_2_ = 0;
  local_1510._18_8_ = 0;
  name_06._8_23_ = in_stack_ffffffffffffe710;
  name_06._M_dataplus._M_p = puVar5;
  name_06.field_2._M_local_buf[0xf] = in_stack_ffffffffffffe727;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._4_92_
       = in_stack_ffffffffffffe72c;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)
       (_Uninitialized<RPCArg::Optional,_true>)in_stack_ffffffffffffe728;
  opts_03.oneline_description._M_string_length._0_1_ = in_stack_ffffffffffffe7b8;
  opts_03.skip_type_check = (bool)in_stack_ffffffffffffe7a8[0];
  opts_03._1_7_ = in_stack_ffffffffffffe7a8._1_7_;
  opts_03.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe7a8._8_8_;
  opts_03.oneline_description._M_string_length._1_7_ = in_stack_ffffffffffffe7b9;
  opts_03.oneline_description.field_2._M_allocated_capacity = in_stack_ffffffffffffe7c0;
  opts_03.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe7c8;
  opts_03.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = in_stack_ffffffffffffe7d0;
  opts_03.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._1_7_ = in_stack_ffffffffffffe7d1;
  opts_03.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe7d8;
  opts_03.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffe7e0;
  opts_03.hidden = (bool)(char)in_stack_ffffffffffffe7e8;
  opts_03.also_positional = (bool)(char)((ushort)in_stack_ffffffffffffe7e8 >> 8);
  opts_03._66_6_ = in_stack_ffffffffffffe7ea;
  RPCArg::RPCArg(&local_1450,name_06,(Type)local_1470,fallback_06,in_stack_ffffffffffffe788,opts_03)
  ;
  __l_02._M_len = 1;
  __l_02._M_array = &local_1450;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xffffffffffffe730,__l_02,
             (allocator_type *)&stack0xffffffffffffe72f);
  local_1578 = &local_1568;
  local_1580[0] = 0;
  local_1570 = 0;
  local_1568 = 0;
  local_1558._0_8_ = (pointer)0x0;
  local_1558._8_2_ = 0;
  local_1558._10_6_ = 0;
  local_1558._16_2_ = 0;
  local_1558._18_8_ = 0;
  name_07._8_23_ = in_stack_ffffffffffffe710;
  name_07._M_dataplus._M_p = local_1580;
  name_07.field_2._M_local_buf[0xf] = in_stack_ffffffffffffe727;
  fallback_07.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._4_92_
       = in_stack_ffffffffffffe72c;
  fallback_07.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)
       (_Uninitialized<RPCArg::Optional,_true>)in_stack_ffffffffffffe728;
  inner_02.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = in_stack_ffffffffffffe7b8;
  inner_02.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffe7a8._0_8_;
  inner_02.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffe7a8._8_8_;
  inner_02.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._1_7_ = in_stack_ffffffffffffe7b9;
  RPCArg::RPCArg(&local_ec8,name_07,(Type)local_12c8,fallback_07,in_stack_ffffffffffffe788,inner_02,
                 (RPCArgOptions *)0x0);
  __l_03._M_len = 2;
  __l_03._M_array = &local_fd0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xffffffffffffe768,__l_03,
             (allocator_type *)&stack0xffffffffffffe72e);
  local_15c0 = &local_15b0;
  local_15c8[0] = 1;
  local_15b8 = 0;
  local_15b0 = 0;
  local_15a0._0_8_ = (pointer)0x0;
  local_15a0._8_2_ = 0;
  local_15a0._10_6_ = 0;
  local_15a0._16_2_ = 0;
  local_15a0._18_8_ = 0;
  puVar5 = local_15c8;
  name_08._8_23_ = in_stack_ffffffffffffe710;
  name_08._M_dataplus._M_p = puVar5;
  name_08.field_2._M_local_buf[0xf] = in_stack_ffffffffffffe727;
  fallback_08.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._4_92_
       = in_stack_ffffffffffffe72c;
  fallback_08.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)
       (_Uninitialized<RPCArg::Optional,_true>)in_stack_ffffffffffffe728;
  inner_03.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = in_stack_ffffffffffffe7b8;
  inner_03.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffe7a8._0_8_;
  inner_03.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffe7a8._8_8_;
  inner_03.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._1_7_ = in_stack_ffffffffffffe7b9;
  RPCArg::RPCArg(&local_350,name_08,(Type)local_d40,fallback_08,in_stack_ffffffffffffe788,inner_03,
                 (RPCArgOptions *)0x1);
  local_15e8[0] = local_15d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_15e8,"locktime","");
  iVar7 = 0;
  UniValue::UniValue<int,_int,_true>(&local_16a0,(int *)&stack0xffffffffffffe728);
  paVar1 = &local_16a0.val.field_2;
  local_1648._8_8_ = (long)&local_1648 + 0x18;
  local_1648._M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)
       (_Uninitialized<RPCArg::Optional,_true>)local_16a0.typ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_16a0.val._M_dataplus._M_p == paVar1) {
    local_1648._32_8_ = local_16a0.val.field_2._8_8_;
  }
  else {
    local_1648._8_8_ = local_16a0.val._M_dataplus._M_p;
  }
  local_1648._16_8_ = local_16a0.val._M_string_length;
  local_16a0.val._M_string_length = 0;
  local_16a0.val.field_2._M_local_buf[0] = '\0';
  local_1648._40_8_ =
       local_16a0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1648._48_8_ =
       local_16a0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1648._56_8_ =
       local_16a0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_16a0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_16a0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_16a0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1648._64_4_ =
       local_16a0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_1648._68_4_ =
       local_16a0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_1648._72_4_ =
       local_16a0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_1648._76_4_ =
       local_16a0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_1648._80_8_ =
       local_16a0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_16a0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_16a0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_16a0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_15f0 = 2;
  local_16c0[0] = local_16b0;
  local_16a0.val._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_16c0,"Raw locktime. Non-0 value also locktime-activates inputs","");
  local_1700 = &local_16f0;
  local_1708 = 0;
  local_16f8 = 0;
  local_16f0 = 0;
  local_16e0._0_8_ = (pointer)0x0;
  local_16e0._8_2_ = 0;
  local_16e0._10_6_ = 0;
  local_16e0._16_2_ = 0;
  local_16e0._18_8_ = 0;
  name_09._8_23_ = in_stack_ffffffffffffe710;
  name_09._M_dataplus._M_p = puVar5;
  name_09.field_2._M_local_buf[0xf] = in_stack_ffffffffffffe727;
  fallback_09.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._4_92_
       = in_stack_ffffffffffffe72c;
  fallback_09.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)(_Uninitialized<RPCArg::Optional,_true>)iVar7;
  opts_04.oneline_description._M_string_length._0_1_ = in_stack_ffffffffffffe7b8;
  opts_04.skip_type_check = (bool)in_stack_ffffffffffffe7a8[0];
  opts_04._1_7_ = in_stack_ffffffffffffe7a8._1_7_;
  opts_04.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe7a8._8_8_;
  opts_04.oneline_description._M_string_length._1_7_ = in_stack_ffffffffffffe7b9;
  opts_04.oneline_description.field_2._M_allocated_capacity = in_stack_ffffffffffffe7c0;
  opts_04.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe7c8;
  opts_04.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = in_stack_ffffffffffffe7d0;
  opts_04.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._1_7_ = in_stack_ffffffffffffe7d1;
  opts_04.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe7d8;
  opts_04.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffe7e0;
  opts_04.hidden = (bool)(char)in_stack_ffffffffffffe7e8;
  opts_04.also_positional = (bool)(char)((ushort)in_stack_ffffffffffffe7e8 >> 8);
  opts_04._66_6_ = in_stack_ffffffffffffe7ea;
  RPCArg::RPCArg(&local_248,name_09,(Type)local_15e8,fallback_09,in_stack_ffffffffffffe788,opts_04);
  local_1728[0] = local_1718;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1728,"replaceable","");
  bVar6 = true;
  UniValue::UniValue<bool,_bool,_true>(&local_17e0,(bool *)&stack0xffffffffffffe727);
  paVar1 = &local_17e0.val.field_2;
  local_1788._8_8_ = (long)&local_1788 + 0x18;
  local_1788._M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)
       (_Uninitialized<RPCArg::Optional,_true>)local_17e0.typ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_17e0.val._M_dataplus._M_p == paVar1) {
    local_1788._32_8_ = local_17e0.val.field_2._8_8_;
  }
  else {
    local_1788._8_8_ = local_17e0.val._M_dataplus._M_p;
  }
  local_1788._16_8_ = local_17e0.val._M_string_length;
  local_17e0.val._M_string_length = 0;
  local_17e0.val.field_2._M_local_buf[0] = '\0';
  local_1788._40_8_ =
       local_17e0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1788._48_8_ =
       local_17e0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1788._56_8_ =
       local_17e0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_17e0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_17e0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_17e0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1788._64_4_ =
       local_17e0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_1788._68_4_ =
       local_17e0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_1788._72_4_ =
       local_17e0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_1788._76_4_ =
       local_17e0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_1788._80_8_ =
       local_17e0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_17e0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_17e0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_17e0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1730 = 2;
  local_1800[0] = local_17f0;
  local_17e0.val._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1800,
             "Marks this transaction as BIP125-replaceable.\nAllows this transaction to be replaced by a transaction with higher fees. If provided, it is an error if explicit sequence numbers are incompatible."
             ,"");
  uVar8 = 0;
  name_10._8_23_ = in_stack_ffffffffffffe710;
  name_10._M_dataplus._M_p = puVar5;
  name_10.field_2._M_local_buf[0xf] = bVar6;
  fallback_10.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._4_92_
       = in_stack_ffffffffffffe72c;
  fallback_10.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)(_Uninitialized<RPCArg::Optional,_true>)iVar7;
  puVar5 = &stack0xffffffffffffe7d0;
  RPCArg::RPCArg(&local_140,name_10,(Type)local_1728,fallback_10,in_stack_ffffffffffffe788,
                 (RPCArgOptions)
                 ZEXT5672(CONCAT848(in_stack_ffffffffffffe7d8,
                                    CONCAT741(in_stack_ffffffffffffe7d1,
                                              ZEXT3241(CONCAT824(&stack0xffffffffffffe7d0,
                                                                 CONCAT717(in_stack_ffffffffffffe7b9
                                                                           ,CONCAT116(0,
                                                  in_stack_ffffffffffffe7a8))))))));
  __l_04._M_len = 4;
  __l_04._M_array = &local_458;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            (in_RDI,__l_04,(allocator_type *)&stack0xffffffffffffe726);
  lVar4 = 0x420;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_478.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + lVar4));
    plVar2 = *(long **)((long)&local_4d8 + lVar4 + 0x40);
    plVar3 = (long *)((long)&local_4d8 + lVar4 + 0x50);
    if (plVar3 != plVar2) {
      operator_delete(plVar2,*plVar3 + 1);
    }
    plVar3 = (long *)((long)&local_4d8 + lVar4 + 0x28);
    plVar2 = *(long **)((long)&local_4d8 + lVar4 + 0x18);
    if (plVar3 != plVar2) {
      operator_delete(plVar2,*plVar3 + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                         *)(local_528 + lVar4 + 8));
    std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)(local_600 + lVar4 + 200));
    if ((long *)(local_600 + lVar4 + 0xb0) != *(long **)(local_600 + lVar4 + 0xa0)) {
      operator_delete(*(long **)(local_600 + lVar4 + 0xa0),*(long *)(local_600 + lVar4 + 0xb0) + 1);
    }
    lVar4 = lVar4 + -0x108;
  } while (lVar4 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xffffffffffffe7e0);
  if (puVar5 != &stack0xffffffffffffe7d0) {
    operator_delete(puVar5,CONCAT71(in_stack_ffffffffffffe7d1,uVar8) + 1);
  }
  if (local_1800[0] != local_17f0) {
    operator_delete(local_1800[0],local_17f0[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_1788._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_17e0.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_17e0.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_17e0.val._M_dataplus._M_p != paVar1) {
    operator_delete(local_17e0.val._M_dataplus._M_p,
                    CONCAT71(local_17e0.val.field_2._M_allocated_capacity._1_7_,
                             local_17e0.val.field_2._M_local_buf[0]) + 1);
  }
  if (local_1728[0] != local_1718) {
    operator_delete(local_1728[0],local_1718[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_16e0);
  if (local_1700 != &local_16f0) {
    operator_delete(local_1700,CONCAT71(uStack_16ef,local_16f0) + 1);
  }
  if (local_16c0[0] != local_16b0) {
    operator_delete(local_16c0[0],local_16b0[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_1648._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_16a0.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_16a0.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_16a0.val._M_dataplus._M_p != &local_16a0.val.field_2) {
    operator_delete(local_16a0.val._M_dataplus._M_p,
                    CONCAT71(local_16a0.val.field_2._M_allocated_capacity._1_7_,
                             local_16a0.val.field_2._M_local_buf[0]) + 1);
  }
  if (local_15e8[0] != local_15d8) {
    operator_delete(local_15e8[0],local_15d8[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_15a0);
  if (local_15c0 != &local_15b0) {
    operator_delete(local_15c0,CONCAT71(uStack_15af,local_15b0) + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xffffffffffffe768);
  lVar4 = 0x210;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_ff0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + lVar4));
    plVar2 = *(long **)((long)&local_1050 + lVar4 + 0x40);
    plVar3 = (long *)((long)&local_1050 + lVar4 + 0x50);
    if (plVar3 != plVar2) {
      operator_delete(plVar2,*plVar3 + 1);
    }
    plVar3 = (long *)((long)&local_1050 + lVar4 + 0x28);
    plVar2 = *(long **)((long)&local_1050 + lVar4 + 0x18);
    if (plVar3 != plVar2) {
      operator_delete(plVar2,*plVar3 + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                         *)(local_10a0 + lVar4 + 8));
    std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)(local_1178 + lVar4 + 200));
    if ((long *)(local_1178 + lVar4 + 0xb0) != *(long **)(local_1178 + lVar4 + 0xa0)) {
      operator_delete(*(long **)(local_1178 + lVar4 + 0xa0),*(long *)(local_1178 + lVar4 + 0xb0) + 1
                     );
    }
    lVar4 = lVar4 + -0x108;
  } while (lVar4 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1558);
  if (local_1578 != &local_1568) {
    operator_delete(local_1578,CONCAT71(uStack_1567,local_1568) + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xffffffffffffe730);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1450.m_opts.type_str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1450.m_opts.oneline_description._M_dataplus._M_p !=
      &local_1450.m_opts.oneline_description.field_2) {
    operator_delete(local_1450.m_opts.oneline_description._M_dataplus._M_p,
                    local_1450.m_opts.oneline_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1450.m_description._M_dataplus._M_p != &local_1450.m_description.field_2) {
    operator_delete(local_1450.m_description._M_dataplus._M_p,
                    local_1450.m_description.field_2._M_allocated_capacity + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_1450.m_fallback);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_1450.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1450.m_names._M_dataplus._M_p != &local_1450.m_names.field_2) {
    operator_delete(local_1450.m_names._M_dataplus._M_p,
                    local_1450.m_names.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1510);
  if (local_1530 != &local_1520) {
    operator_delete(local_1530,CONCAT71(uStack_151f,local_1520) + 1);
  }
  if (local_14f0[0] != local_14e0) {
    operator_delete(local_14f0[0],local_14e0[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_14d0._M_first);
  if (local_1470[0] != local_1460) {
    operator_delete(local_1470[0],local_1460[0] + 1);
  }
  if (local_1348[0] != local_1338) {
    operator_delete(local_1348[0],local_1338[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_1328._M_first);
  if (local_12c8[0] != local_12b8) {
    operator_delete(local_12c8[0],local_12b8[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1280);
  if (local_12a0 != &local_1290) {
    operator_delete(local_12a0,CONCAT71(uStack_128f,local_1290) + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xffffffffffffe750);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1090);
  if ((undefined1 *)local_1178._200_8_ != local_10a0) {
    operator_delete((void *)local_1178._200_8_,local_10a0._0_8_ + 1);
  }
  if ((undefined1 *)local_1178._160_8_ != local_1178 + 0xb0) {
    operator_delete((void *)local_1178._160_8_,local_1178._176_8_ + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)(local_1178 + 0x40));
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)(local_1178 + 0x28));
  if ((undefined1 *)local_1178._0_8_ != local_1178 + 0x10) {
    operator_delete((void *)local_1178._0_8_,local_1178._16_8_ + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1238);
  if (local_1258 != &local_1248) {
    operator_delete(local_1258,CONCAT71(uStack_1247,local_1248) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1218._M_dataplus._M_p != &local_1218.field_2) {
    operator_delete(local_1218._M_dataplus._M_p,local_1218.field_2._M_allocated_capacity + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_11f8._M_first);
  if (local_1198[0] != local_1188) {
    operator_delete(local_1198[0],local_1188[0] + 1);
  }
  if (local_1070[0] != local_1060) {
    operator_delete(local_1070[0],local_1060[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_1050._M_first);
  if (local_ff0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_ff0.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl + 0x10U)) {
    operator_delete(local_ff0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_ff0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (local_dc0[0] != local_db0) {
    operator_delete(local_dc0[0],local_db0[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_da0._M_first);
  if (local_d40[0] != local_d30) {
    operator_delete(local_d40[0],local_d30[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_cf8);
  if (local_d18 != &local_d08) {
    operator_delete(local_d18,CONCAT71(uStack_d07,local_d08) + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xffffffffffffe7a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_518);
  if ((undefined1 *)local_600._200_8_ != local_528) {
    operator_delete((void *)local_600._200_8_,local_528._0_8_ + 1);
  }
  if ((undefined1 *)local_600._160_8_ != local_600 + 0xb0) {
    operator_delete((void *)local_600._160_8_,local_600._176_8_ + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)(local_600 + 0x40));
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)(local_600 + 0x28));
  if ((undefined1 *)local_600._0_8_ != local_600 + 0x10) {
    operator_delete((void *)local_600._0_8_,local_600._16_8_ + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_cb0);
  if (local_cd0 != &local_cc0) {
    operator_delete(local_cd0,CONCAT71(uStack_cbf,local_cc0) + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xffffffffffffe788);
  lVar4 = 0x318;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_9d8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + lVar4));
    plVar2 = *(long **)((long)&local_a38 + lVar4 + 0x40);
    plVar3 = (long *)((long)&local_a38 + lVar4 + 0x50);
    if (plVar3 != plVar2) {
      operator_delete(plVar2,*plVar3 + 1);
    }
    plVar3 = (long *)((long)&local_a38 + lVar4 + 0x28);
    plVar2 = *(long **)((long)&local_a38 + lVar4 + 0x18);
    if (plVar3 != plVar2) {
      operator_delete(plVar2,*plVar3 + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                         *)(auStack_a80 + lVar4));
    std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)
               ((long)&local_a98.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl + lVar4
               ));
    if ((long *)((long)local_ab0 + lVar4) != *(long **)((long)local_ac0 + lVar4)) {
      operator_delete(*(long **)((long)local_ac0 + lVar4),*(long *)((long)local_ab0 + lVar4) + 1);
    }
    lVar4 = lVar4 + -0x108;
  } while (lVar4 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_c68);
  if (local_c88 != &local_c78) {
    operator_delete(local_c88,CONCAT71(uStack_c77,local_c78) + 1);
  }
  if (local_c48[0] != local_c38) {
    operator_delete(local_c48[0],local_c38[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_c08._M_first);
  if (local_c28 != &local_c18) {
    operator_delete(local_c28,CONCAT44(uStack_c14,local_c18) + 1);
  }
  if (local_ba8[0] != local_b98) {
    operator_delete(local_ba8[0],local_b98[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_b60);
  if (local_b80 != &local_b70) {
    operator_delete(local_b80,CONCAT71(uStack_b6f,local_b70) + 1);
  }
  if (local_b40[0] != local_b30) {
    operator_delete(local_b40[0],local_b30[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_b20._M_first);
  if (local_ac0[0] != local_ab0) {
    operator_delete(local_ac0[0],local_ab0[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_a78);
  if (local_a98.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      (pointer)((long)&local_a98.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl + 0x10U
               )) {
    operator_delete(local_a98.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT71(local_a98.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._1_7_,
                             local_a98.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_1_) + 1);
  }
  if (local_a58[0] != local_a48) {
    operator_delete(local_a58[0],local_a48[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_a38._M_first);
  if (local_9d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_9d8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl + 0x10U)) {
    operator_delete(local_9d8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_9d8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (local_6a0[0] != local_690) {
    operator_delete(local_6a0[0],local_690[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_680._M_first);
  if (local_620[0] != local_610) {
    operator_delete(local_620[0],local_610[0] + 1);
  }
  if (local_4f8[0] != local_4e8) {
    operator_delete(local_4f8[0],local_4e8[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_4d8._M_first);
  if (local_478.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_478.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl + 0x10U)) {
    operator_delete(local_478.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_478.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (*(vector<RPCArg,_std::allocator<RPCArg>_> **)(in_FS_OFFSET + 0x28) == local_38) {
    return *(vector<RPCArg,_std::allocator<RPCArg>_> **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static std::vector<RPCArg> CreateTxDoc()
{
    return {
        {"inputs", RPCArg::Type::ARR, RPCArg::Optional::NO, "The inputs",
            {
                {"", RPCArg::Type::OBJ, RPCArg::Optional::OMITTED, "",
                    {
                        {"txid", RPCArg::Type::STR_HEX, RPCArg::Optional::NO, "The transaction id"},
                        {"vout", RPCArg::Type::NUM, RPCArg::Optional::NO, "The output number"},
                        {"sequence", RPCArg::Type::NUM, RPCArg::DefaultHint{"depends on the value of the 'replaceable' and 'locktime' arguments"}, "The sequence number"},
                    },
                },
            },
        },
        {"outputs", RPCArg::Type::ARR, RPCArg::Optional::NO, "The outputs specified as key-value pairs.\n"
                "Each key may only appear once, i.e. there can only be one 'data' output, and no address may be duplicated.\n"
                "At least one output of either type must be specified.\n"
                "For compatibility reasons, a dictionary, which holds the key-value pairs directly, is also\n"
                "                             accepted as second parameter.",
            {
                {"", RPCArg::Type::OBJ_USER_KEYS, RPCArg::Optional::OMITTED, "",
                    {
                        {"address", RPCArg::Type::AMOUNT, RPCArg::Optional::NO, "A key-value pair. The key (string) is the bitcoin address, the value (float or string) is the amount in " + CURRENCY_UNIT},
                    },
                },
                {"", RPCArg::Type::OBJ, RPCArg::Optional::OMITTED, "",
                    {
                        {"data", RPCArg::Type::STR_HEX, RPCArg::Optional::NO, "A key-value pair. The key must be \"data\", the value is hex-encoded data"},
                    },
                },
            },
         RPCArgOptions{.skip_type_check = true}},
        {"locktime", RPCArg::Type::NUM, RPCArg::Default{0}, "Raw locktime. Non-0 value also locktime-activates inputs"},
        {"replaceable", RPCArg::Type::BOOL, RPCArg::Default{true}, "Marks this transaction as BIP125-replaceable.\n"
                "Allows this transaction to be replaced by a transaction with higher fees. If provided, it is an error if explicit sequence numbers are incompatible."},
    };
}